

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_parser.cpp
# Opt level: O2

string * __thiscall
duckdb::SQLLogicParser::ExtractStatement_abi_cxx11_
          (string *__return_storage_ptr__,SQLLogicParser *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_00;
  bool bVar1;
  reference pvVar2;
  bool bVar3;
  idx_t __n;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = &this->lines;
  __n = this->current_line;
  bVar3 = true;
  while( true ) {
    if ((ulong)((long)(this->lines).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->lines).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= __n) {
      return __return_storage_ptr__;
    }
    pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(this_00,__n);
    bVar1 = EmptyOrComment((string *)pvVar2);
    if (bVar1) break;
    pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(this_00,this->current_line);
    bVar1 = std::operator==(pvVar2,"----");
    if (bVar1) {
      return __return_storage_ptr__;
    }
    if (!bVar3) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    get<true>(this_00,this->current_line);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    __n = this->current_line + 1;
    this->current_line = __n;
    bVar3 = false;
  }
  return __return_storage_ptr__;
}

Assistant:

string SQLLogicParser::ExtractStatement() {
	string statement;

	bool first_line = true;
	while (current_line < lines.size() && !EmptyOrComment(lines[current_line])) {
		if (lines[current_line] == "----") {
			break;
		}
		if (!first_line) {
			statement += "\n";
		}
		statement += lines[current_line];
		first_line = false;

		current_line++;
	}

	return statement;
}